

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

uoffset_t __thiscall flatbuffers::Parser::ParseVector(Parser *this,Type *type)

{
  FlatBufferBuilder *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StructDef *pSVar2;
  pointer ppVar3;
  pointer pcVar4;
  pointer pFVar5;
  double dVar6;
  Offset<void> off;
  uint8_t *puVar7;
  ulonglong uVar8;
  ulonglong *puVar9;
  float *pfVar10;
  double *pdVar11;
  int *piVar12;
  int iVar13;
  long lVar14;
  uint litle_endian_element;
  int iVar15;
  size_t alignment;
  Value local_108;
  BaseType local_c8;
  BaseType BStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  EnumDef *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  int local_90;
  undefined8 local_88;
  pair<flatbuffers::Value,_flatbuffers::FieldDef_*> local_78;
  
  iVar15 = 0;
  if (this->token_ != 0x5d) {
    paVar1 = &local_78.first.constant.field_2;
    iVar15 = 0;
    do {
      local_108.constant._M_dataplus._M_p = (pointer)&local_108.constant.field_2;
      local_108.constant.field_2._M_allocated_capacity._0_2_ = 0x30;
      local_108.constant._M_string_length = 1;
      local_108.offset = -1;
      local_108.type.base_type = type->base_type;
      local_108.type.element = type->element;
      local_108.type.struct_def = type->struct_def;
      local_108.type.enum_def = type->enum_def;
      ParseAnyValue(this,&local_108,(FieldDef *)0x0);
      local_b8 = local_108.type.enum_def;
      local_c8 = local_108.type.base_type;
      BStack_c4 = local_108.type.element;
      uStack_c0 = local_108.type.struct_def._0_4_;
      uStack_bc = local_108.type.struct_def._4_4_;
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_108.constant._M_dataplus._M_p,
                 local_108.constant._M_dataplus._M_p + local_108.constant._M_string_length);
      local_90 = local_108.offset;
      local_88 = 0;
      local_78.first.type.element = BStack_c4;
      local_78.first.type.base_type = local_c8;
      local_78.first.type.struct_def = (StructDef *)CONCAT44(uStack_bc,uStack_c0);
      local_78.first.type.enum_def = local_b8;
      if (local_b0 == &local_a0) {
        local_78.first.constant.field_2._8_8_ = local_a0._8_8_;
        local_78.first.constant._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_78.first.constant._M_dataplus._M_p = (pointer)local_b0;
      }
      local_78.first.constant.field_2._M_allocated_capacity._1_7_ =
           local_a0._M_allocated_capacity._1_7_;
      local_78.first.constant.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
      local_78.first.constant._M_string_length = local_a8;
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      local_78.first.offset = local_108.offset;
      local_78.second = (FieldDef *)0x0;
      local_b0 = &local_a0;
      std::
      vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
      ::emplace_back<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>
                ((vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
                  *)&this->field_stack_,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.first.constant._M_dataplus._M_p != paVar1) {
        operator_delete(local_78.first.constant._M_dataplus._M_p);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      iVar13 = this->token_;
      if (iVar13 != 0x5d) {
        Expect(this,0x2c);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.constant._M_dataplus._M_p != &local_108.constant.field_2) {
        operator_delete(local_108.constant._M_dataplus._M_p);
      }
      iVar15 = iVar15 + 1;
    } while (iVar13 != 0x5d);
  }
  Next(this);
  this_00 = &this->builder_;
  lVar14 = (long)iVar15;
  if ((ulong)type->base_type == 0xf) {
    pSVar2 = type->struct_def;
    if (pSVar2->fixed == false) {
      lVar14 = lVar14 << 2;
      alignment = 4;
    }
    else {
      lVar14 = lVar14 * pSVar2->bytesize;
      alignment = pSVar2->minalign;
    }
  }
  else {
    alignment = (size_t)(char)kTypeSizes[type->base_type];
    lVar14 = lVar14 * alignment;
  }
  FlatBufferBuilder::PreAlign(this_00,lVar14 * alignment,4);
  FlatBufferBuilder::PreAlign(this_00,lVar14 * alignment,alignment);
  iVar13 = iVar15;
  if (0 < iVar15) {
    do {
      ppVar3 = (this->field_stack_).
               super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      switch(ppVar3[-1].first.type.base_type) {
      case BASE_TYPE_NONE:
      case BASE_TYPE_UTYPE:
      case BASE_TYPE_BOOL:
      case BASE_TYPE_CHAR:
      case BASE_TYPE_UCHAR:
        uVar8 = strtoull(ppVar3[-1].first.constant._M_dataplus._M_p,(char **)0x0,10);
        CheckBitsFit(uVar8,8);
        FlatBufferBuilder::Align(this_00,1);
        puVar7 = vector_downward::make_space(&this_00->buf_,1);
        *puVar7 = (uint8_t)uVar8;
        break;
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT:
        uVar8 = strtoull(ppVar3[-1].first.constant._M_dataplus._M_p,(char **)0x0,10);
        CheckBitsFit(uVar8,0x10);
        FlatBufferBuilder::Align(this_00,2);
        puVar7 = vector_downward::make_space(&this_00->buf_,2);
        *(short *)puVar7 = (short)uVar8;
        break;
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT:
        uVar8 = strtoull(ppVar3[-1].first.constant._M_dataplus._M_p,(char **)0x0,10);
        CheckBitsFit(uVar8,0x20);
        FlatBufferBuilder::Align(this_00,4);
        puVar7 = vector_downward::make_space(&this_00->buf_,4);
        *(int *)puVar7 = (int)uVar8;
        break;
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG:
        uVar8 = strtoull(ppVar3[-1].first.constant._M_dataplus._M_p,(char **)0x0,10);
        FlatBufferBuilder::Align(this_00,8);
        puVar9 = (ulonglong *)vector_downward::make_space(&this_00->buf_,8);
        *puVar9 = uVar8;
        break;
      case BASE_TYPE_FLOAT:
        dVar6 = strtod(ppVar3[-1].first.constant._M_dataplus._M_p,(char **)0x0);
        FlatBufferBuilder::Align(this_00,4);
        pfVar10 = (float *)vector_downward::make_space(&this_00->buf_,4);
        *pfVar10 = (float)dVar6;
        break;
      case BASE_TYPE_DOUBLE:
        dVar6 = strtod(ppVar3[-1].first.constant._M_dataplus._M_p,(char **)0x0);
        FlatBufferBuilder::Align(this_00,8);
        pdVar11 = (double *)vector_downward::make_space(&this_00->buf_,8);
        *pdVar11 = dVar6;
        break;
      case BASE_TYPE_STRING:
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_UNION:
switchD_0010cd0e_caseD_d:
        off.o = atoi(ppVar3[-1].first.constant._M_dataplus._M_p);
        FlatBufferBuilder::PushElement<void>(this_00,off);
        break;
      case BASE_TYPE_STRUCT:
        pSVar2 = ppVar3[-1].first.type.struct_def;
        if (pSVar2->fixed != true) goto switchD_0010cd0e_caseD_d;
        SerializeStruct(this,pSVar2,&ppVar3[-1].first);
      }
      ppVar3 = (this->field_stack_).
               super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->field_stack_).
      super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar3 + -1;
      pcVar4 = ppVar3[-1].first.constant._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &ppVar3[-1].first.constant.field_2) {
        operator_delete(pcVar4);
      }
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  pFVar5 = (this->builder_).offsetbuf_.
           super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->builder_).offsetbuf_.
      super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar5) {
    (this->builder_).offsetbuf_.
    super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar5;
  }
  FlatBufferBuilder::Align(this_00,4);
  piVar12 = (int *)vector_downward::make_space(&this_00->buf_,4);
  *piVar12 = iVar15;
  return ((int)(this->builder_).buf_.reserved_ - *(int *)&(this->builder_).buf_.cur_) +
         *(int *)&(this->builder_).buf_.buf_;
}

Assistant:

uoffset_t Parser::ParseVector(const Type &type) {
  int count = 0;
  if (token_ != ']') for (;;) {
    Value val;
    val.type = type;
    ParseAnyValue(val, NULL);
    field_stack_.push_back(std::make_pair(val, nullptr));
    count++;
    if (token_ == ']') break;
    Expect(',');
  }
  Next();

  builder_.StartVector(count * InlineSize(type), InlineAlignment((type)));
  for (int i = 0; i < count; i++) {
    // start at the back, since we're building the data backwards.
    auto &val = field_stack_.back().first;
    switch (val.type.base_type) {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
        case BASE_TYPE_ ## ENUM: \
          if (IsStruct(val.type)) SerializeStruct(*val.type.struct_def, val); \
          else builder_.PushElement(atot<CTYPE>(val.constant.c_str())); \
          break;
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
    }
    field_stack_.pop_back();
  }

  builder_.ClearOffsets();
  return builder_.EndVector(count);
}